

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O3

ptr<log_store> __thiscall raft_functional_common::TestMgr::load_log_store(TestMgr *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  ptr<log_store> pVar2;
  ptr<log_store> pVar3;
  
  in_RDI->_vptr_log_store =
       (_func_int **)
       (this->curLogStore).super___shared_ptr<nuraft::inmem_log_store,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (this->curLogStore).
           super___shared_ptr<nuraft::inmem_log_store,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  in_RDI[1]._vptr_log_store = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      pVar2.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      pVar2.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (ptr<log_store>)pVar2.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  pVar3.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<log_store>)pVar3.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<log_store> load_log_store() {
        return curLogStore;
    }